

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.h
# Opt level: O1

bool __thiscall
JsUtil::CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler>::Contains
          (CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler> *this,
          EvalMapStringInternal<false> *value)

{
  bool bVar1;
  ulong uVar2;
  EvalMapStringInternal<false> *this_00;
  ulong uVar3;
  byte bVar4;
  
  bVar4 = this->writeIndex != 0 | this->filled;
  if ((bVar4 == 1) &&
     (bVar1 = Js::EvalMapStringInternal<false>::operator==(this->entries,value), !bVar1)) {
    this_00 = this->entries;
    uVar3 = 0;
    do {
      this_00 = this_00 + 1;
      uVar3 = uVar3 + 1;
      uVar2 = (ulong)this->writeIndex;
      if (this->filled != false) {
        uVar2 = 0xf;
      }
      bVar4 = uVar3 < uVar2;
      if (!(bool)bVar4) {
        return (bool)bVar4;
      }
      bVar1 = Js::EvalMapStringInternal<false>::operator==(this_00,value);
    } while (!bVar1);
  }
  return (bool)bVar4;
}

Assistant:

bool Contains(const T& value)
        {
            for (uint i = 0; i < GetMaxIndex(); i++)
            {
                if (DefaultComparer<T>::Equals(entries[i], value))
                {
                    return true;
                }
            }

            return false;
        }